

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O2

void Keyset::cryptBlocksInternal<unsigned_int*,unsigned_int*,false,void>
               (uint *srcFirst,uint *srcLast,uint *dstFirst)

{
  ValueType prevBlock;
  undefined1 local_4 [4];
  
  if (srcFirst != srcLast) {
    swap_bytes(*srcFirst);
    *dstFirst = *srcFirst;
    if (srcFirst + 1 != srcLast) {
      std::
      transform<unsigned_int*,unsigned_int*,Keyset::cryptBlocksInternal<unsigned_int*,unsigned_int*,false,void>(unsigned_int*,unsigned_int*,unsigned_int*)::_lambda(unsigned_int)_1_>
                (srcFirst + 1,srcLast,dstFirst + 1,(anon_class_8_1_e1d520ba)local_4);
    }
  }
  return;
}

Assistant:

static void cryptBlocksInternal(InputIt srcFirst, InputIt srcLast, OutputIt dstFirst)
	{
		if (srcFirst == srcLast) {
			return;
		}

		typedef typename std::iterator_traits<InputIt>::value_type ValueType;
		using boost::endian::endian_reverse;

		ValueType prevBlock = endian_reverse(*srcFirst++);
		*dstFirst++ = (NeedSwapEndian ? prevBlock : endian_reverse(prevBlock));

		if (srcFirst == srcLast) {
			return;
		}

		std::transform(
			srcFirst, srcLast, dstFirst,
			[&prevBlock](const ValueType in) {
				const ValueType curBlock = endian_reverse(in);
				ValueType out = cryptBlock(curBlock, prevBlock);
				if (!NeedSwapEndian) {
					out = endian_reverse(out);
				}
				prevBlock = curBlock;
				return out;
			}
		);
	}